

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.hpp
# Opt level: O1

string * __thiscall
toml::concat_to_string<char_const(&)[28],std::__cxx11::string,char_const(&)[3]>
          (string *__return_storage_ptr__,toml *this,char (*args) [28],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
          char (*args_2) [3])

{
  uint *puVar1;
  char (*in_R9) [3];
  ostringstream oss;
  long local_1a0 [3];
  uint auStack_188 [22];
  ios_base local_130 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  puVar1 = (uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18));
  *puVar1 = *puVar1 | 1;
  *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) =
       *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) & 0xfffffefb | 4;
  detail::concat_to_string_impl<char_const(&)[28],std::__cxx11::string,char_const(&)[3]>
            (__return_storage_ptr__,(detail *)local_1a0,(ostringstream *)this,args,args_1,in_R9);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

std::string concat_to_string(Ts&& ... args)
{
    std::ostringstream oss;
    oss << std::boolalpha << std::fixed;
    return detail::concat_to_string_impl(oss, std::forward<Ts>(args) ...);
}